

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_parser.cc
# Opt level: O0

void __thiscall iqxmlrpc::ValueBuilder::do_visit_element(ValueBuilder *this,string *tagname)

{
  int iVar1;
  Value_type *pVVar2;
  Nil *this_00;
  element_type *peVar3;
  string *tagname_local;
  ValueBuilder *this_local;
  
  iVar1 = StateMachine::change(&this->state_,tagname);
  if (iVar1 == 8) {
    pVVar2 = BuilderBase::
             sub_build<iqxmlrpc::Value_type*,iqxmlrpc::(anonymous_namespace)::StructBuilder>
                       ((BuilderBase *)this,true);
    std::auto_ptr<iqxmlrpc::Value_type>::reset(&(this->super_ValueBuilderBase).retval,pVVar2);
  }
  else if (iVar1 == 9) {
    pVVar2 = BuilderBase::
             sub_build<iqxmlrpc::Value_type*,iqxmlrpc::(anonymous_namespace)::ArrayBuilder>
                       ((BuilderBase *)this,true);
    std::auto_ptr<iqxmlrpc::Value_type>::reset(&(this->super_ValueBuilderBase).retval,pVVar2);
  }
  else if (iVar1 == 10) {
    this_00 = (Nil *)operator_new(0x10);
    memset(this_00,0,0x10);
    Nil::Nil(this_00);
    std::auto_ptr<iqxmlrpc::Value_type>::reset
              (&(this->super_ValueBuilderBase).retval,(element_type *)this_00);
  }
  peVar3 = std::auto_ptr<iqxmlrpc::Value_type>::get(&(this->super_ValueBuilderBase).retval);
  if (peVar3 != (element_type *)0x0) {
    BuilderBase::want_exit((BuilderBase *)this);
  }
  return;
}

Assistant:

void
ValueBuilder::do_visit_element(const std::string& tagname)
{
  switch (state_.change(tagname)) {
  case STRUCT:
    retval.reset(sub_build<Value_type*, StructBuilder>(true));
    break;

  case ARRAY:
    retval.reset(sub_build<Value_type*, ArrayBuilder>(true));
    break;

  case NIL:
    retval.reset(new Nil());
    break;

  default:
    // wait for text within <i4>...</i4>, etc...
    break;
  }

  if (retval.get())
    want_exit();
}